

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O2

void Gia_ManCreateValueRefs(Gia_Man_t *p)

{
  ulong uVar1;
  int iVar2;
  Gia_Obj_t *pObj;
  ulong uVar3;
  int v;
  
  v = 0;
  do {
    if (p->nObjs <= v) {
      return;
    }
    pObj = Gia_ManObj(p,v);
    if (pObj == (Gia_Obj_t *)0x0) {
      return;
    }
    pObj->Value = 0;
    uVar1 = *(ulong *)pObj;
    uVar3 = uVar1 & 0x1fffffff;
    if (uVar3 == 0x1fffffff || (int)uVar1 < 0) {
      if ((int)uVar1 < 0 && (int)uVar3 != 0x1fffffff) goto LAB_002143e6;
    }
    else {
      pObj[-uVar3].Value = pObj[-uVar3].Value + 1;
      iVar2 = Gia_ObjIsBuf(pObj);
      if (iVar2 == 0) {
        uVar3 = (ulong)((uint)(uVar1 >> 0x20) & 0x1fffffff);
LAB_002143e6:
        pObj[-uVar3].Value = pObj[-uVar3].Value + 1;
      }
    }
    v = v + 1;
  } while( true );
}

Assistant:

void Gia_ManCreateValueRefs( Gia_Man_t * p )  
{
    Gia_Obj_t * pObj;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        pObj->Value = 0;
        if ( Gia_ObjIsAnd(pObj) )
        {
            Gia_ObjFanin0(pObj)->Value++;
            if ( !Gia_ObjIsBuf(pObj) )
                Gia_ObjFanin1(pObj)->Value++;
        }
        else if ( Gia_ObjIsCo(pObj) )
            Gia_ObjFanin0(pObj)->Value++;
    }
}